

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderVariableVkImpl::BindResource(ShaderVariableVkImpl *this,BindResourceInfo *BindInfo)

{
  ShaderVariableManagerVk *pSVar1;
  BindResourceHelper BindHelper;
  BindResourceHelper local_50;
  
  pSVar1 = (this->
           super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
           ).m_ParentManager;
  anon_unknown_77::BindResourceHelper::BindResourceHelper
            (&local_50,
             (pSVar1->
             super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
             ).m_pSignature,
             (pSVar1->
             super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
             ).m_ResourceCache,
             (this->
             super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
             ).m_ResIndex,BindInfo->ArrayIndex);
  anon_unknown_77::BindResourceHelper::operator()(&local_50,BindInfo);
  return;
}

Assistant:

void BindResource(const BindResourceInfo& BindInfo) const
    {
        m_ParentManager.BindResource(m_ResIndex, BindInfo);
    }